

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_compiler.c
# Opt level: O0

gravity_compiler_t * gravity_compiler_create(gravity_delegate_t *delegate)

{
  void_r *pvVar1;
  gravity_compiler_t *compiler;
  gravity_delegate_t *delegate_local;
  
  delegate_local = (gravity_delegate_t *)gravity_calloc((gravity_vm *)0x0,1,0x30);
  if (delegate_local == (gravity_delegate_t *)0x0) {
    delegate_local = (gravity_delegate_t *)0x0;
  }
  else {
    delegate_local->error_callback = (gravity_error_callback)0x0;
    pvVar1 = void_array_create();
    delegate_local->unittest_callback = (gravity_unittest_callback)pvVar1;
    *(gravity_delegate_t **)&delegate_local->report_null_errors = delegate;
  }
  return (gravity_compiler_t *)delegate_local;
}

Assistant:

gravity_compiler_t *gravity_compiler_create (gravity_delegate_t *delegate) {
    gravity_compiler_t *compiler = mem_alloc(NULL, sizeof(gravity_compiler_t));
    if (!compiler) return NULL;

    compiler->ast = NULL;
    compiler->objects = void_array_create();
    compiler->delegate = delegate;
    return compiler;
}